

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-think-dungeon-util.c
# Opt level: O3

_Bool borg_think_dungeon_light(void)

{
  uint8_t uVar1;
  short sVar2;
  ushort uVar3;
  short sVar4;
  borg_grid *pbVar5;
  chunk_conflict *pcVar6;
  _Bool _Var7;
  borg_need bVar8;
  long lVar9;
  loc lVar10;
  bool bVar11;
  long lVar12;
  keycode_t k;
  long lVar13;
  int y;
  
  if ((borg.trait[0x6d] != 0) && (_Var7 = borg_use_things(), _Var7)) {
    return true;
  }
  if ((borg.trait[0x1a] == 0) && (0 < borg.trait[0x69])) {
    if (borg.goal.recalling != L'\0') {
      borg_keypress(0x52);
      borg_keypress(0x39);
      borg_keypress(0x9c);
      return true;
    }
    _Var7 = borg_wear_stuff();
    if (_Var7) {
      return true;
    }
    bVar8 = borg_maintain_light();
    if (bVar8 == BORG_MET_NEED) {
      return true;
    }
    if (bVar8 == BORG_NO_NEED) {
      return false;
    }
    if (borg.goal.recalling == L'\0') {
      _Var7 = borg_zap_rod(sv_rod_recall);
      if (_Var7) {
        return true;
      }
      if ((borg.goal.recalling == L'\0') && (_Var7 = borg_recall(), _Var7)) {
        return true;
      }
    }
    if (((player->opts).opt[0x20] == false) && (borg_grids[borg.c.y][borg.c.x].feat == '\x05')) {
      borg_note("# Testing for stairs .");
      borg_keypress(0x3c);
    }
    if ((((0 < borg.trait[0x1f] && borg.trait[0x1e] < borg.trait[0x1f]) &&
         ((((borg_grids[borg.c.y][borg.c.x].info & 2) != 0 || (borg.trait[0x19] == 4)) &&
          (borg.trait[0x6c] == 0)))) &&
        (((_Var7 = borg_spell_legal(HERBAL_CURING), _Var7 ||
          (_Var7 = borg_spell_legal(REMOVE_HUNGER), _Var7)) ||
         (borg.trait[0x69] <= borg.trait[0x27])))) &&
       (((_Var7 = borg_spell_legal(CALL_LIGHT), _Var7 ||
         (_Var7 = borg_spell_legal(LIGHT_ROOM), _Var7)) &&
        ((_Var7 = borg_spell_okay(CALL_LIGHT), !_Var7 &&
         (_Var7 = borg_spell_okay(LIGHT_ROOM), !_Var7)))))) {
      lVar12 = 0;
      bVar11 = false;
      do {
        pcVar6 = cave;
        lVar9 = (long)borg.c.x;
        sVar2 = ddx_ddd[lVar12];
        lVar13 = (long)borg.c.y;
        sVar4 = ddy_ddd[lVar12];
        lVar10 = (loc)loc((int)(sVar2 + lVar9),(int)(sVar4 + lVar13));
        _Var7 = square_in_bounds_fully(pcVar6,lVar10);
        if (_Var7) {
          bVar11 = (bool)(bVar11 | borg_grids[sVar4 + lVar13][sVar2 + lVar9].kill != '\0');
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != 8);
      if (((int)(uint)borg_fear_monsters[borg.c.y][borg.c.x] <= borg.trait[0x1b] / 10 && !bVar11) &&
          (int)(uint)borg_fear_region[borg.c.y / 0xb][borg.c.x / 0xb] <= borg.trait[0x1b] / 10) {
        borg_note("# Resting on this Glowing Grid to gain mana.");
        borg_keypress(0x52);
        borg_keypress(0x2a);
        k = 0x9c;
        goto LAB_00244d0c;
      }
    }
    if ((borg.when_call_light == 0) || (7 < (int)borg_t - (int)borg.when_call_light)) {
      lVar12 = 0;
      do {
        pcVar6 = cave;
        lVar13 = (long)ddx_ddd[lVar12] + (long)borg.c.x;
        lVar9 = (long)borg.c.y;
        sVar2 = ddy_ddd[lVar12];
        y = (int)(sVar2 + lVar9);
        lVar10 = (loc)loc((int)lVar13,y);
        _Var7 = square_in_bounds_fully(pcVar6,lVar10);
        if (_Var7) {
          pbVar5 = borg_grids[sVar2 + lVar9];
          uVar1 = pbVar5[lVar13].feat;
          if (6 < (byte)(uVar1 - 0x10)) {
            if ((((byte)(uVar1 - 3) < 2) && (y == borg.c.y)) && ((int)lVar13 == borg.c.x)) {
              lVar10.y = borg.c.y;
              lVar10.x = borg.c.x;
              _Var7 = square_isglow(cave,lVar10);
              if (_Var7) {
                *(byte *)&pbVar5[lVar13].info = (byte)pbVar5[lVar13].info | 2;
              }
            }
            else {
              uVar3 = pbVar5[lVar13].info;
              if (borg.trait[0x19] == 4) {
                if ((((uVar3 & 4) == 0) || (uVar1 == '\0' || (uVar3 & 3) != 1)) &&
                   (_Var7 = borg_spell(CREATE_DARKNESS), _Var7)) {
                  borg_note("# Darkening the region that is lit.");
                  borg.when_call_light = borg_t;
                  return true;
                }
              }
              else if (((uVar3 & 4) != 0) || (uVar1 == '\0' || (~uVar3 & 3) != 0)) {
                _Var7 = borg_activate_item(act_illumination);
                if ((((_Var7) ||
                     ((_Var7 = borg_activate_item(act_light), _Var7 ||
                      (_Var7 = borg_zap_rod(sv_rod_illumination), _Var7)))) ||
                    (_Var7 = borg_use_staff(sv_staff_light), _Var7)) ||
                   (((_Var7 = borg_read_scroll(sv_scroll_light), _Var7 ||
                     (_Var7 = borg_spell(CALL_LIGHT), _Var7)) ||
                    (_Var7 = borg_spell(LIGHT_ROOM), _Var7)))) {
                  borg_note("# Illuminating the region while dark.");
                  borg_react("SELF:lite","SELF:lite");
                  borg.when_call_light = borg_t;
                  return true;
                }
                _Var7 = borg_light_beam(false);
                if (_Var7) {
                  return true;
                }
              }
            }
          }
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != 8);
    }
    _Var7 = borg_flow_old(L'\a');
    if (_Var7) {
      return true;
    }
    _Var7 = borg_flow_stair_less(7,false);
    if ((_Var7) && ((player->opts).opt[0x20] == false)) {
      if (borg_grids[borg.c.y][borg.c.x].feat != '\x05') {
        borg_note("# Flowing to stairs (low Light).");
        return true;
      }
      borg_note("# Taking up Stairs (low Light).");
      k = 0x3c;
LAB_00244d0c:
      borg_keypress(k);
      return true;
    }
    if (borg.trait[0x26] != 0) {
      _Var7 = borg_flow_light(L'\a');
      return _Var7;
    }
  }
  return false;
}

Assistant:

bool borg_think_dungeon_light(void)
{
    int        ii, x, y;
    bool       not_safe = false;
    borg_grid *ag;

    /* Consume needed things */
    if (borg.trait[BI_ISHUNGRY] && borg_use_things())
        return true;

    if (!borg.trait[BI_LIGHT]
        && (borg.trait[BI_LIGHT] <= 0 || borg_items[INVEN_LIGHT].timeout <= 3)
        && borg.trait[BI_CDEPTH] >= 1) {
        enum borg_need need;

        /* I am recalling, sit here till it engages. */
        if (borg.goal.recalling) {
            /* just wait */
            borg_keypress('R');
            borg_keypress('9');
            borg_keypress(KC_ENTER);
            return true;
        }

        /* wear stuff and see if it glows */
        if (borg_wear_stuff())
            return true;

        /* attempt to refuel/swap */
        need = borg_maintain_light();
        if (need == BORG_MET_NEED)
            return true;
        if (need == BORG_NO_NEED)
            return false;

        /* Can I recall out with a rod */
        if (!borg.goal.recalling && borg_zap_rod(sv_rod_recall))
            return true;

        /* Can I recall out with a spell */
        if (!borg.goal.recalling && borg_recall())
            return true;

        /* Test for stairs */
        if (!OPT(player, birth_force_descend)) {
            /* Usable stairs */
            if (borg_grids[borg.c.y][borg.c.x].feat == FEAT_LESS) {
                /* Log */
                borg_note("# Testing for stairs .");

                borg_keypress('<');
            }
        }

        /* If on a glowing grid, got some food, and low mana, then rest here */
        if ((borg.trait[BI_CURSP] < borg.trait[BI_MAXSP]
                && borg.trait[BI_MAXSP] > 0)
            && ((borg_grids[borg.c.y][borg.c.x].info & BORG_GLOW)
                || borg.trait[BI_CLASS] == CLASS_NECROMANCER)
            && !borg.trait[BI_ISWEAK]
            && (borg_spell_legal(HERBAL_CURING)
                || borg_spell_legal(REMOVE_HUNGER)
                || borg.trait[BI_FOOD] >= borg.trait[BI_CDEPTH])
            && (borg_spell_legal(CALL_LIGHT) || borg_spell_legal(LIGHT_ROOM))
            && (!borg_spell_okay(CALL_LIGHT) && !borg_spell_okay(LIGHT_ROOM))) {
            /* Scan grids adjacent to me */
            for (ii = 0; ii < 8; ii++) {
                x = borg.c.x + ddx_ddd[ii];
                y = borg.c.y + ddy_ddd[ii];

                /* Bounds check */
                if (!square_in_bounds_fully(cave, loc(x, y)))
                    continue;

                /* Access the grid */
                ag = &borg_grids[y][x];

                /* Check for adjacent Monster */
                if (ag->kill) {
                    not_safe = true;
                }
            }

            /* Be concerned about the Regional Fear. */
            if (borg_fear_region[borg.c.y / 11][borg.c.x / 11]
                > borg.trait[BI_CURHP] / 10)
                not_safe = true;

            /* Be concerned about the Monster Fear. */
            if (borg_fear_monsters[borg.c.y][borg.c.x]
                > borg.trait[BI_CURHP] / 10)
                not_safe = true;

            /* rest here to gain some mana */
            if (!not_safe) {
                borg_note("# Resting on this Glowing Grid to gain mana.");
                borg_keypress('R');
                borg_keypress('*');
                borg_keypress(KC_ENTER);
                return true;
            }
        }

        /* If I have the capacity to Call Light, then do so if adjacent to a
         * dark grid. We can illuminate the entire dungeon, looking for stairs
         * but not if we just did so.
         */
        if (borg.when_call_light == 0 || (borg_t - borg.when_call_light) > 7) {
            /* Scan grids adjacent to me */
            for (ii = 0; ii < 8; ii++) {
                x = borg.c.x + ddx_ddd[ii];
                y = borg.c.y + ddy_ddd[ii];

                /* Bounds check */
                if (!square_in_bounds_fully(cave, loc(x, y)))
                    continue;

                /* Access the grid */
                ag = &borg_grids[y][x];

                /* skip the Wall grids */
                if (ag->feat >= FEAT_RUBBLE && ag->feat <= FEAT_PERM)
                    continue;

                /* Problem with casting Call Light on Open Doors */
                if ((ag->feat == FEAT_OPEN || ag->feat == FEAT_BROKEN)
                    && (y == borg.c.y && x == borg.c.x)) {
                    /* Cheat the grid info to see if the door is lit */
                    if (square_isglow(cave, borg.c))
                        ag->info |= BORG_GLOW;
                    continue;
                }

                /* Look for a dark one */
                if (borg.trait[BI_CLASS] != CLASS_NECROMANCER) {
                    if ((ag->info & BORG_DARK) || /* Known to be dark */
                        ag->feat == FEAT_NONE || /* Nothing known about feature */
                        !(ag->info & BORG_MARK) || /* Nothing known about info */
                        !(ag->info & BORG_GLOW)) /* not glowing */
                    {
                        /* Attempt to Call Light */
                        if (borg_activate_item(act_illumination)
                            || borg_activate_item(act_light)
                            || borg_zap_rod(sv_rod_illumination)
                            || borg_use_staff(sv_staff_light)
                            || borg_read_scroll(sv_scroll_light)
                            || borg_spell(CALL_LIGHT) || borg_spell(LIGHT_ROOM)) {
                            borg_note("# Illuminating the region while dark.");
                            borg_react("SELF:lite", "SELF:lite");
                            borg.when_call_light = borg_t;

                            return true;
                        }

                        /* Attempt to use Light Beam requiring a direction. */
                        if (borg_light_beam(false))
                            return true;
                    }
                } else {
                    if (!(ag->info & BORG_DARK) || /* Not dark */
                        ag->feat == FEAT_NONE || /* Nothing known about feature */
                        !(ag->info & BORG_MARK) || /* Nothing known about info */
                        (ag->info & BORG_GLOW)) /* glowing */
                    {
                        if (borg_spell(CREATE_DARKNESS)) {
                            borg_note("# Darkening the region that is lit.");
                            borg.when_call_light = borg_t;
                            return true;
                        }
                    }
                }
            }
        }

        /* don't flee to the stairs if already fleeing */
        if (borg_flow_old(GOAL_FLEE))
            return true;

        /* Try to flow to upstairs if on level one */
        if (borg_flow_stair_less(GOAL_FLEE, false) && !OPT(player, birth_force_descend)) {
            /* Usable stairs */
            if (borg_grids[borg.c.y][borg.c.x].feat == FEAT_LESS) {

                /* Take the stairs */
                borg_note("# Taking up Stairs (low Light).");
                borg_keypress('<');
                return true;
            }
            borg_note("# Flowing to stairs (low Light).");
            return true;
        }

        /* Try to flow to a lite */
        if (borg.trait[BI_RECALL] && borg_flow_light(GOAL_FLEE)) {
            return true;
        }
    }
    /* Nothing to do */
    return false;
}